

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_impl.hpp
# Opt level: O0

value * __thiscall lightconf::value::operator=(value *this,value *rhs)

{
  value *rhs_local;
  value *this_local;
  
  if (rhs != this) {
    this->number_value_ = rhs->number_value_;
    std::__cxx11::string::operator=((string *)&this->string_value_,(string *)&rhs->string_value_);
    this->bool_value_ = (bool)(rhs->bool_value_ & 1);
    std::vector<lightconf::value,_std::allocator<lightconf::value>_>::operator=
              (&this->vector_value_,&rhs->vector_value_);
    group::operator=(&this->group_value_,&rhs->group_value_);
    this->type_ = rhs->type_;
  }
  return this;
}

Assistant:

inline value& value::operator=(const value& rhs) {
    if (&rhs != this) {
        number_value_ = rhs.number_value_;
        string_value_ = rhs.string_value_;
        bool_value_ = rhs.bool_value_;
        vector_value_ = rhs.vector_value_;
        group_value_ = rhs.group_value_;
        type_ = rhs.type_;
    }
    return *this;
}